

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printAbsBranchOperand(MCInst *MI,uint OpNo,SStream *O)

{
  cs_struct *h;
  cs_detail *pcVar1;
  _Bool _Var2;
  uint id;
  MCOperand *pMVar3;
  int64_t iVar4;
  uint8_t *puVar5;
  uint local_24;
  int imm;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  pMVar3 = MCInst_getOperand(MI,OpNo);
  _Var2 = MCOperand_isImm(pMVar3);
  if (_Var2) {
    pMVar3 = MCInst_getOperand(MI,OpNo);
    iVar4 = MCOperand_getImm(pMVar3);
    local_24 = (int)iVar4 * 4;
    h = MI->csh;
    id = MCInst_getOpcode(MI);
    _Var2 = PPC_abs_branch(h,id);
    if (!_Var2) {
      local_24 = (int)MI->address + local_24;
    }
    SStream_concat(O,"0x%x",(ulong)local_24);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar5 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1a;
      puVar5[0] = '\x02';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1e) = local_24;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
    }
  }
  else {
    printOperand(MI,OpNo,O);
  }
  return;
}

Assistant:

static void printAbsBranchOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int imm;

	if (!MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		printOperand(MI, OpNo, O);
		return;
	}

	imm = ((int)MCOperand_getImm(MCInst_getOperand(MI, OpNo)) << 2);

	if (!PPC_abs_branch(MI->csh, MCInst_getOpcode(MI))) {
		imm = (int)MI->address + imm;
	}

	SStream_concat(O, "0x%x", imm);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = imm;
		MI->flat_insn->detail->ppc.op_count++;
	}
}